

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# checker.cc
# Opt level: O0

bool __thiscall xLearn::Checker::check_train_options(Checker *this,HyperParam *hyper_param)

{
  bool bVar1;
  int iVar2;
  uint uVar3;
  reference pvVar4;
  undefined8 uVar5;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *__lhs;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbVar6;
  char *pcVar7;
  string *out;
  ulong uVar8;
  long in_RSI;
  long in_RDI;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *this_00;
  float fVar9;
  double dVar10;
  string similar_str;
  real_t value_14;
  real_t value_13;
  real_t value_12;
  real_t value_11;
  int value_10;
  int value_9;
  int value_8;
  int value_7;
  int value_6;
  int value_5;
  real_t value_4;
  real_t value_3;
  real_t value_2;
  int value_1;
  int value;
  int i;
  StrSimilar ss;
  StringList list;
  bool bo;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *in_stack_fffffffffffffbd8;
  string *in_stack_fffffffffffffbe0;
  __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  *in_stack_fffffffffffffbe8;
  undefined7 in_stack_fffffffffffffbf0;
  undefined1 in_stack_fffffffffffffbf7;
  allocator *in_stack_fffffffffffffc00;
  allocator_type *in_stack_fffffffffffffc08;
  __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  __last;
  __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  in_stack_fffffffffffffc20;
  string local_3d0 [36];
  undefined4 local_3ac;
  string local_3a8 [16];
  char *in_stack_fffffffffffffc68;
  string local_388 [32];
  string local_368 [36];
  float local_344;
  string local_340 [8];
  string local_318 [36];
  float local_2f4;
  string local_2f0 [36];
  float local_2cc;
  string local_2c8 [32];
  undefined4 in_stack_fffffffffffffd58;
  uint in_stack_fffffffffffffd5c;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *in_stack_fffffffffffffd60;
  string *in_stack_fffffffffffffd68;
  StrSimilar *in_stack_fffffffffffffd70;
  string local_278 [32];
  undefined4 in_stack_fffffffffffffda8;
  uint in_stack_fffffffffffffdac;
  Checker *in_stack_fffffffffffffdb0;
  string local_228 [36];
  uint local_204;
  string local_200 [36];
  uint local_1dc;
  string local_1d8 [36];
  float local_1b4;
  string local_1b0 [36];
  float local_18c;
  string local_188 [36];
  float local_164;
  string local_160 [36];
  uint local_13c;
  string local_138 [32];
  string local_118 [32];
  string local_f8 [39];
  allocator local_d1;
  string local_d0 [36];
  int local_ac;
  int local_a8;
  StrSimilar local_a2;
  undefined1 local_a1 [9];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_98;
  undefined8 local_90;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_88;
  string local_60 [32];
  string local_40 [39];
  byte local_19;
  long local_18;
  byte local_1;
  
  local_19 = 1;
  local_18 = in_RSI;
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::operator[]((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                *)(in_RDI + 0x18),1);
  std::__cxx11::string::c_str();
  bVar1 = FileExist(in_stack_fffffffffffffc68);
  if (bVar1) {
    pvVar4 = std::
             vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ::operator[]((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                           *)(in_RDI + 0x18),1);
    std::__cxx11::string::string(local_40,(string *)pvVar4);
    std::__cxx11::string::operator=((string *)(local_18 + 200),local_40);
    std::__cxx11::string::~string(local_40);
    this_00 = (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)(in_RDI + 0x18);
    local_98 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               std::
               vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ::begin(in_stack_fffffffffffffbd8);
    local_90 = __gnu_cxx::
               __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
               ::operator+(in_stack_fffffffffffffbe8,(difference_type)in_stack_fffffffffffffbe0);
    local_a1._1_8_ =
         std::
         vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         ::end(in_stack_fffffffffffffbd8);
    __last._M_current =
         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_a1;
    std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::allocator((allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                 *)0x1f231f);
    std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
    vector<__gnu_cxx::__normal_iterator<std::__cxx11::string*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>,void>
              (this_00,in_stack_fffffffffffffc20,__last,in_stack_fffffffffffffc08);
    std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::~allocator((allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)0x1f2350);
    StrSimilar::StrSimilar(&local_a2);
    local_a8 = 0;
    while( true ) {
      __lhs = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)(long)local_a8;
      pbVar6 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               std::
               vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ::size(&local_88);
      if (pbVar6 <= __lhs) break;
      pvVar4 = std::
               vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ::operator[](&local_88,(long)local_a8);
      iVar2 = std::__cxx11::string::compare((char *)pvVar4);
      if (iVar2 == 0) {
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::operator[](&local_88,(long)(local_a8 + 1));
        pcVar7 = (char *)std::__cxx11::string::c_str();
        local_ac = atoi(pcVar7);
        if ((local_ac < 0) || (5 < local_ac)) {
          in_stack_fffffffffffffc00 = &local_d1;
          std::allocator<char>::allocator();
          std::__cxx11::string::string
                    (local_d0,
                     "-s can only be [0 - 5] : \n  for classification task: \n    0 -- linear model (GLM) \n    1 -- factorization machines (FM) \n    2 -- field-aware factorization machines (FFM) \n  for regression task: \n    3 -- linear model (GLM) \n    4 -- factorization machines (FM) \n    5 -- field-aware factorization machines (FFM)"
                     ,in_stack_fffffffffffffc00);
          Color::print_error(in_stack_fffffffffffffbe0);
          std::__cxx11::string::~string(local_d0);
          std::allocator<char>::~allocator((allocator<char> *)&local_d1);
          local_19 = 0;
        }
        else {
          switch(local_ac) {
          case 0:
            std::__cxx11::string::operator=((string *)(local_18 + 0x28),"cross-entropy");
            std::__cxx11::string::operator=((string *)(local_18 + 8),"linear");
            break;
          case 1:
            std::__cxx11::string::operator=((string *)(local_18 + 0x28),"cross-entropy");
            std::__cxx11::string::operator=((string *)(local_18 + 8),"fm");
            break;
          case 2:
            std::__cxx11::string::operator=((string *)(local_18 + 0x28),"cross-entropy");
            std::__cxx11::string::operator=((string *)(local_18 + 8),"ffm");
            break;
          case 3:
            std::__cxx11::string::operator=((string *)(local_18 + 0x28),"squared");
            std::__cxx11::string::operator=((string *)(local_18 + 8),"linear");
            break;
          case 4:
            std::__cxx11::string::operator=((string *)(local_18 + 0x28),"squared");
            std::__cxx11::string::operator=((string *)(local_18 + 8),"fm");
            break;
          case 5:
            std::__cxx11::string::operator=((string *)(local_18 + 0x28),"squared");
            std::__cxx11::string::operator=((string *)(local_18 + 8),"ffm");
          }
        }
        local_a8 = local_a8 + 2;
      }
      else {
        pvVar4 = std::
                 vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 ::operator[](&local_88,(long)local_a8);
        iVar2 = std::__cxx11::string::compare((char *)pvVar4);
        if (iVar2 == 0) {
          pvVar4 = std::
                   vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   ::operator[](&local_88,(long)(local_a8 + 1));
          iVar2 = std::__cxx11::string::compare((char *)pvVar4);
          if (iVar2 == 0) {
LAB_001f294a:
            pvVar4 = std::
                     vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     ::operator[](&local_88,(long)(local_a8 + 1));
            std::__cxx11::string::operator=((string *)(local_18 + 0x48),(string *)pvVar4);
          }
          else {
            pvVar4 = std::
                     vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     ::operator[](&local_88,(long)(local_a8 + 1));
            iVar2 = std::__cxx11::string::compare((char *)pvVar4);
            if (iVar2 == 0) goto LAB_001f294a;
            pvVar4 = std::
                     vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     ::operator[](&local_88,(long)(local_a8 + 1));
            iVar2 = std::__cxx11::string::compare((char *)pvVar4);
            if (iVar2 == 0) goto LAB_001f294a;
            pvVar4 = std::
                     vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     ::operator[](&local_88,(long)(local_a8 + 1));
            iVar2 = std::__cxx11::string::compare((char *)pvVar4);
            if (iVar2 == 0) goto LAB_001f294a;
            pvVar4 = std::
                     vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     ::operator[](&local_88,(long)(local_a8 + 1));
            iVar2 = std::__cxx11::string::compare((char *)pvVar4);
            if (iVar2 == 0) goto LAB_001f294a;
            pvVar4 = std::
                     vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     ::operator[](&local_88,(long)(local_a8 + 1));
            iVar2 = std::__cxx11::string::compare((char *)pvVar4);
            if (iVar2 == 0) goto LAB_001f294a;
            pvVar4 = std::
                     vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     ::operator[](&local_88,(long)(local_a8 + 1));
            iVar2 = std::__cxx11::string::compare((char *)pvVar4);
            if (iVar2 == 0) goto LAB_001f294a;
            pvVar4 = std::
                     vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     ::operator[](&local_88,(long)(local_a8 + 1));
            iVar2 = std::__cxx11::string::compare((char *)pvVar4);
            if (iVar2 == 0) goto LAB_001f294a;
            pvVar4 = std::
                     vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     ::operator[](&local_88,(long)(local_a8 + 1));
            iVar2 = std::__cxx11::string::compare((char *)pvVar4);
            if (iVar2 == 0) goto LAB_001f294a;
            pvVar4 = std::
                     vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     ::operator[](&local_88,(long)(local_a8 + 1));
            iVar2 = std::__cxx11::string::compare((char *)pvVar4);
            if (iVar2 == 0) goto LAB_001f294a;
            std::
            vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ::operator[](&local_88,(long)(local_a8 + 1));
            uVar5 = std::__cxx11::string::c_str();
            StringPrintf_abi_cxx11_
                      ((char *)local_f8,
                       "Unknow metric: %s \n -x can only be: \n   acc \n   prec \n   recall \n   f1 \n   auc\n   mae \n   mape \n   rmsd \n   rmse \n   none"
                       ,uVar5);
            Color::print_error(in_stack_fffffffffffffbe0);
            std::__cxx11::string::~string(local_f8);
            local_19 = 0;
          }
          local_a8 = local_a8 + 2;
        }
        else {
          pvVar4 = std::
                   vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   ::operator[](&local_88,(long)local_a8);
          iVar2 = std::__cxx11::string::compare((char *)pvVar4);
          if (iVar2 == 0) {
            pvVar4 = std::
                     vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     ::operator[](&local_88,(long)(local_a8 + 1));
            iVar2 = std::__cxx11::string::compare((char *)pvVar4);
            if (iVar2 == 0) {
LAB_001f2adc:
              pvVar4 = std::
                       vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       ::operator[](&local_88,(long)(local_a8 + 1));
              std::__cxx11::string::operator=((string *)(local_18 + 0x70),(string *)pvVar4);
            }
            else {
              pvVar4 = std::
                       vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       ::operator[](&local_88,(long)(local_a8 + 1));
              iVar2 = std::__cxx11::string::compare((char *)pvVar4);
              if (iVar2 == 0) goto LAB_001f2adc;
              pvVar4 = std::
                       vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       ::operator[](&local_88,(long)(local_a8 + 1));
              iVar2 = std::__cxx11::string::compare((char *)pvVar4);
              if (iVar2 == 0) goto LAB_001f2adc;
              std::
              vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ::operator[](&local_88,(long)(local_a8 + 1));
              uVar5 = std::__cxx11::string::c_str();
              StringPrintf_abi_cxx11_
                        ((char *)local_118,
                         "Unknow optimization method: %s \n -o can only be: adagrad and ftrl. \n",
                         uVar5);
              Color::print_error(in_stack_fffffffffffffbe0);
              std::__cxx11::string::~string(local_118);
              local_19 = 0;
            }
            local_a8 = local_a8 + 2;
          }
          else {
            pvVar4 = std::
                     vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     ::operator[](&local_88,(long)local_a8);
            iVar2 = std::__cxx11::string::compare((char *)pvVar4);
            if (iVar2 == 0) {
              std::
              vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ::operator[](&local_88,(long)(local_a8 + 1));
              std::__cxx11::string::c_str();
              in_stack_fffffffffffffbf7 = FileExist(in_stack_fffffffffffffc68);
              if ((bool)in_stack_fffffffffffffbf7) {
                pvVar4 = std::
                         vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         ::operator[](&local_88,(long)(local_a8 + 1));
                std::__cxx11::string::operator=((string *)(local_18 + 0x108),(string *)pvVar4);
              }
              else {
                std::
                vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ::operator[](&local_88,(long)(local_a8 + 1));
                uVar5 = std::__cxx11::string::c_str();
                StringPrintf_abi_cxx11_
                          ((char *)local_138,"Validation set file: %s dose not exists.",uVar5);
                Color::print_error(in_stack_fffffffffffffbe0);
                std::__cxx11::string::~string(local_138);
                local_19 = 0;
              }
              local_a8 = local_a8 + 2;
            }
            else {
              pvVar4 = std::
                       vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       ::operator[](&local_88,(long)local_a8);
              iVar2 = std::__cxx11::string::compare((char *)pvVar4);
              if (iVar2 == 0) {
                pvVar4 = std::
                         vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         ::operator[](&local_88,(long)(local_a8 + 1));
                std::__cxx11::string::operator=((string *)(local_18 + 0x140),(string *)pvVar4);
                local_a8 = local_a8 + 2;
              }
              else {
                pvVar4 = std::
                         vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         ::operator[](&local_88,(long)local_a8);
                iVar2 = std::__cxx11::string::compare((char *)pvVar4);
                if (iVar2 == 0) {
                  pvVar4 = std::
                           vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                           ::operator[](&local_88,(long)(local_a8 + 1));
                  std::__cxx11::string::operator=((string *)(local_18 + 0x180),(string *)pvVar4);
                  local_a8 = local_a8 + 2;
                }
                else {
                  pvVar4 = std::
                           vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                           ::operator[](&local_88,(long)local_a8);
                  iVar2 = std::__cxx11::string::compare((char *)pvVar4);
                  if (iVar2 == 0) {
                    pvVar4 = std::
                             vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                             ::operator[](&local_88,(long)(local_a8 + 1));
                    std::__cxx11::string::operator=((string *)(local_18 + 0x1c0),(string *)pvVar4);
                    local_a8 = local_a8 + 2;
                  }
                  else {
                    pvVar4 = std::
                             vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                             ::operator[](&local_88,(long)local_a8);
                    iVar2 = std::__cxx11::string::compare((char *)pvVar4);
                    if (iVar2 == 0) {
                      std::
                      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      ::operator[](&local_88,(long)(local_a8 + 1));
                      pcVar7 = (char *)std::__cxx11::string::c_str();
                      local_13c = atoi(pcVar7);
                      if ((int)local_13c < 1) {
                        StringPrintf_abi_cxx11_
                                  ((char *)local_160,
                                   "Illegal -k \'%i\'. -k must be geater than zero.",
                                   (ulong)local_13c);
                        Color::print_error(in_stack_fffffffffffffbe0);
                        std::__cxx11::string::~string(local_160);
                        local_19 = 0;
                      }
                      else {
                        *(uint *)(local_18 + 0xc0) = local_13c;
                      }
                      local_a8 = local_a8 + 2;
                    }
                    else {
                      pvVar4 = std::
                               vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                               ::operator[](&local_88,(long)local_a8);
                      iVar2 = std::__cxx11::string::compare((char *)pvVar4);
                      if (iVar2 == 0) {
                        std::
                        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        ::operator[](&local_88,(long)(local_a8 + 1));
                        pcVar7 = (char *)std::__cxx11::string::c_str();
                        dVar10 = atof(pcVar7);
                        local_164 = (float)dVar10;
                        if (0.0 < local_164) {
                          *(float *)(local_18 + 0x94) = local_164;
                        }
                        else {
                          StringPrintf_abi_cxx11_
                                    ((char *)(double)local_164,local_188,
                                     "Illegal -r : \'%f\'. -r must be greater than zero.");
                          Color::print_error(in_stack_fffffffffffffbe0);
                          std::__cxx11::string::~string(local_188);
                          local_19 = 0;
                        }
                        local_a8 = local_a8 + 2;
                      }
                      else {
                        pvVar4 = std::
                                 vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                 ::operator[](&local_88,(long)local_a8);
                        iVar2 = std::__cxx11::string::compare((char *)pvVar4);
                        if (iVar2 == 0) {
                          std::
                          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                          ::operator[](&local_88,(long)(local_a8 + 1));
                          pcVar7 = (char *)std::__cxx11::string::c_str();
                          dVar10 = atof(pcVar7);
                          local_18c = (float)dVar10;
                          if (0.0 <= local_18c) {
                            *(float *)(local_18 + 0x98) = local_18c;
                          }
                          else {
                            StringPrintf_abi_cxx11_
                                      ((char *)(double)local_18c,local_1b0,
                                       "Illegal -b : \'%f\' -b must be greater than or equal to zero."
                                      );
                            Color::print_error(in_stack_fffffffffffffbe0);
                            std::__cxx11::string::~string(local_1b0);
                            local_19 = 0;
                          }
                          local_a8 = local_a8 + 2;
                        }
                        else {
                          pvVar4 = std::
                                   vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                   ::operator[](&local_88,(long)local_a8);
                          iVar2 = std::__cxx11::string::compare((char *)pvVar4);
                          if (iVar2 == 0) {
                            std::
                            vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                            ::operator[](&local_88,(long)(local_a8 + 1));
                            pcVar7 = (char *)std::__cxx11::string::c_str();
                            dVar10 = atof(pcVar7);
                            local_1b4 = (float)dVar10;
                            if (0.0 < local_1b4) {
                              *(float *)(local_18 + 0x9c) = local_1b4;
                            }
                            else {
                              StringPrintf_abi_cxx11_
                                        ((char *)(double)local_1b4,local_1d8,
                                         "Illegal -u : \'%f\'. -u must be greater than zero.");
                              Color::print_error(in_stack_fffffffffffffbe0);
                              std::__cxx11::string::~string(local_1d8);
                              local_19 = 0;
                            }
                            local_a8 = local_a8 + 2;
                          }
                          else {
                            pvVar4 = std::
                                     vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                     ::operator[](&local_88,(long)local_a8);
                            iVar2 = std::__cxx11::string::compare((char *)pvVar4);
                            if (iVar2 == 0) {
                              std::
                              vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                              ::operator[](&local_88,(long)(local_a8 + 1));
                              pcVar7 = (char *)std::__cxx11::string::c_str();
                              local_1dc = atoi(pcVar7);
                              if ((int)local_1dc < 0) {
                                StringPrintf_abi_cxx11_
                                          ((char *)local_200,
                                           "Illegal -e : \'%i\'. -e must be greater than zero.",
                                           (ulong)local_1dc);
                                Color::print_error(in_stack_fffffffffffffbe0);
                                std::__cxx11::string::~string(local_200);
                                local_19 = 0;
                              }
                              else {
                                *(uint *)(local_18 + 0xb0) = local_1dc;
                              }
                              local_a8 = local_a8 + 2;
                            }
                            else {
                              pvVar4 = std::
                                       vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                       ::operator[](&local_88,(long)local_a8);
                              iVar2 = std::__cxx11::string::compare((char *)pvVar4);
                              if (iVar2 == 0) {
                                std::
                                vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                ::operator[](&local_88,(long)(local_a8 + 1));
                                pcVar7 = (char *)std::__cxx11::string::c_str();
                                local_204 = atoi(pcVar7);
                                if ((int)local_204 < 0) {
                                  StringPrintf_abi_cxx11_
                                            ((char *)local_228,
                                             "Illegal -f : \'%i\'. -f must be greater than zero.",
                                             (ulong)local_204);
                                  Color::print_error(in_stack_fffffffffffffbe0);
                                  std::__cxx11::string::~string(local_228);
                                  local_19 = 0;
                                }
                                else {
                                  *(uint *)(local_18 + 0x1f0) = local_204;
                                }
                                local_a8 = local_a8 + 2;
                              }
                              else {
                                pvVar4 = std::
                                         vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                         ::operator[](&local_88,(long)local_a8);
                                iVar2 = std::__cxx11::string::compare((char *)pvVar4);
                                if (iVar2 == 0) {
                                  pvVar4 = std::
                                           vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                           ::operator[](&local_88,(long)(local_a8 + 1));
                                  std::__cxx11::string::operator=
                                            ((string *)(local_18 + 0x160),(string *)pvVar4);
                                  local_a8 = local_a8 + 2;
                                }
                                else {
                                  pvVar4 = std::
                                           vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                           ::operator[](&local_88,(long)local_a8);
                                  iVar2 = std::__cxx11::string::compare((char *)pvVar4);
                                  if (iVar2 == 0) {
                                    std::
                                    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                    ::operator[](&local_88,(long)(local_a8 + 1));
                                    pcVar7 = (char *)std::__cxx11::string::c_str();
                                    uVar3 = atoi(pcVar7);
                                    if ((int)uVar3 < 1) {
                                      StringPrintf_abi_cxx11_
                                                (&stack0xfffffffffffffdb0,
                                                 "Illegal -nthread : \'%i\'. -nthread must be greater than zero."
                                                 ,(ulong)uVar3);
                                      Color::print_error(in_stack_fffffffffffffbe0);
                                      std::__cxx11::string::~string
                                                ((string *)&stack0xfffffffffffffdb0);
                                      local_19 = 0;
                                    }
                                    else {
                                      *(uint *)(local_18 + 0x68) = uVar3;
                                    }
                                    local_a8 = local_a8 + 2;
                                  }
                                  else {
                                    pvVar4 = std::
                                             vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                             ::operator[](&local_88,(long)local_a8);
                                    iVar2 = std::__cxx11::string::compare((char *)pvVar4);
                                    if (iVar2 == 0) {
                                      std::
                                      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                      ::operator[](&local_88,(long)(local_a8 + 1));
                                      pcVar7 = (char *)std::__cxx11::string::c_str();
                                      in_stack_fffffffffffffdac = atoi(pcVar7);
                                      if ((int)in_stack_fffffffffffffdac < 1) {
                                        StringPrintf_abi_cxx11_
                                                  ((char *)local_278,
                                                                                                      
                                                  "Illegal -block : \'%i\'. -block must be greater than zero."
                                                  ,(ulong)in_stack_fffffffffffffdac);
                                        Color::print_error(in_stack_fffffffffffffbe0);
                                        std::__cxx11::string::~string(local_278);
                                        local_19 = 0;
                                      }
                                      else {
                                        *(uint *)(local_18 + 0x1e0) = in_stack_fffffffffffffdac;
                                      }
                                      local_a8 = local_a8 + 2;
                                    }
                                    else {
                                      pvVar4 = std::
                                               vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                               ::operator[](&local_88,(long)local_a8);
                                      iVar2 = std::__cxx11::string::compare((char *)pvVar4);
                                      if (iVar2 == 0) {
                                        std::
                                        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                        ::operator[](&local_88,(long)(local_a8 + 1));
                                        pcVar7 = (char *)std::__cxx11::string::c_str();
                                        uVar3 = atoi(pcVar7);
                                        if ((int)uVar3 < 1) {
                                          StringPrintf_abi_cxx11_
                                                    (&stack0xfffffffffffffd60,
                                                                                                          
                                                  "Illegal -sw : \'%i\'. -sw must be greater than or equal to 1."
                                                  ,(ulong)uVar3);
                                          Color::print_error(in_stack_fffffffffffffbe0);
                                          std::__cxx11::string::~string
                                                    ((string *)&stack0xfffffffffffffd60);
                                          local_19 = 0;
                                        }
                                        else {
                                          *(uint *)(local_18 + 0x1f8) = uVar3;
                                        }
                                        local_a8 = local_a8 + 2;
                                      }
                                      else {
                                        pvVar4 = std::
                                                 vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                 ::operator[](&local_88,(long)local_a8);
                                        iVar2 = std::__cxx11::string::compare((char *)pvVar4);
                                        if (iVar2 == 0) {
                                          std::
                                          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                          ::operator[](&local_88,(long)(local_a8 + 1));
                                          pcVar7 = (char *)std::__cxx11::string::c_str();
                                          in_stack_fffffffffffffd5c = atoi(pcVar7);
                                          if ((int)in_stack_fffffffffffffd5c < 1) {
                                            StringPrintf_abi_cxx11_
                                                      ((char *)local_2c8,
                                                                                                              
                                                  "Illegal -seed : \'%i\'. -seed must be greater than or equal to 1."
                                                  ,(ulong)in_stack_fffffffffffffd5c);
                                            Color::print_error(in_stack_fffffffffffffbe0);
                                            std::__cxx11::string::~string(local_2c8);
                                            local_19 = 0;
                                          }
                                          else {
                                            *(uint *)(local_18 + 0x1e8) = in_stack_fffffffffffffd5c;
                                          }
                                          local_a8 = local_a8 + 2;
                                        }
                                        else {
                                          pvVar4 = std::
                                                  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  ::operator[](&local_88,(long)local_a8);
                                          iVar2 = std::__cxx11::string::compare((char *)pvVar4);
                                          if (iVar2 == 0) {
                                            *(undefined1 *)(local_18 + 1) = 1;
                                            local_a8 = local_a8 + 1;
                                          }
                                          else {
                                            pvVar4 = std::
                                                  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  ::operator[](&local_88,(long)local_a8);
                                            iVar2 = std::__cxx11::string::compare((char *)pvVar4);
                                            if (iVar2 == 0) {
                                              *(undefined1 *)(local_18 + 0x1ee) = 1;
                                              local_a8 = local_a8 + 1;
                                            }
                                            else {
                                              pvVar4 = std::
                                                  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  ::operator[](&local_88,(long)local_a8);
                                              iVar2 = std::__cxx11::string::compare((char *)pvVar4);
                                              if (iVar2 == 0) {
                                                *(undefined1 *)(local_18 + 0xb5) = 0;
                                                local_a8 = local_a8 + 1;
                                              }
                                              else {
                                                pvVar4 = std::
                                                  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  ::operator[](&local_88,(long)local_a8);
                                                iVar2 = std::__cxx11::string::compare
                                                                  ((char *)pvVar4);
                                                if (iVar2 == 0) {
                                                  *(undefined1 *)(local_18 + 500) = 0;
                                                  local_a8 = local_a8 + 1;
                                                }
                                                else {
                                                  pvVar4 = std::
                                                  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  ::operator[](&local_88,(long)local_a8);
                                                  iVar2 = std::__cxx11::string::compare
                                                                    ((char *)pvVar4);
                                                  if (iVar2 == 0) {
                                                    *(undefined1 *)(local_18 + 0xb4) = 0;
                                                    local_a8 = local_a8 + 1;
                                                  }
                                                  else {
                                                    pvVar4 = std::
                                                  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  ::operator[](&local_88,(long)local_a8);
                                                  iVar2 = std::__cxx11::string::compare
                                                                    ((char *)pvVar4);
                                                  if (iVar2 == 0) {
                                                    *(undefined1 *)(local_18 + 0x1e4) = 0;
                                                    local_a8 = local_a8 + 1;
                                                  }
                                                  else {
                                                    pvVar4 = std::
                                                  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  ::operator[](&local_88,(long)local_a8);
                                                  iVar2 = std::__cxx11::string::compare
                                                                    ((char *)pvVar4);
                                                  if (iVar2 == 0) {
                                                    *(undefined1 *)(local_18 + 2) = 1;
                                                    local_a8 = local_a8 + 1;
                                                  }
                                                  else {
                                                    pvVar4 = std::
                                                  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  ::operator[](&local_88,(long)local_a8);
                                                  iVar2 = std::__cxx11::string::compare
                                                                    ((char *)pvVar4);
                                                  if (iVar2 == 0) {
                                                    std::
                                                  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  ::operator[](&local_88,(long)(local_a8 + 1));
                                                  pcVar7 = (char *)std::__cxx11::string::c_str();
                                                  dVar10 = atof(pcVar7);
                                                  local_2cc = (float)dVar10;
                                                  if (0.0 < local_2cc) {
                                                    *(float *)(local_18 + 0xa0) = local_2cc;
                                                  }
                                                  else {
                                                    StringPrintf_abi_cxx11_
                                                              ((char *)(double)local_2cc,local_2f0,
                                                                                                                              
                                                  "Illegal -alpha : \'%f\'. -alpha must be greater than zero."
                                                  );
                                                  Color::print_error(in_stack_fffffffffffffbe0);
                                                  std::__cxx11::string::~string(local_2f0);
                                                  local_19 = 0;
                                                  }
                                                  }
                                                  else {
                                                    pvVar4 = std::
                                                  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  ::operator[](&local_88,(long)local_a8);
                                                  iVar2 = std::__cxx11::string::compare
                                                                    ((char *)pvVar4);
                                                  if (iVar2 == 0) {
                                                    std::
                                                  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  ::operator[](&local_88,(long)(local_a8 + 1));
                                                  pcVar7 = (char *)std::__cxx11::string::c_str();
                                                  dVar10 = atof(pcVar7);
                                                  local_2f4 = (float)dVar10;
                                                  if (0.0 <= local_2f4) {
                                                    *(float *)(local_18 + 0xa4) = local_2f4;
                                                  }
                                                  else {
                                                    StringPrintf_abi_cxx11_
                                                              ((char *)(double)local_2f4,local_318,
                                                                                                                              
                                                  "Illegal -beta : \'%f\'. -beta cannot be less than zero."
                                                  );
                                                  Color::print_error(in_stack_fffffffffffffbe0);
                                                  std::__cxx11::string::~string(local_318);
                                                  local_19 = 0;
                                                  }
                                                  }
                                                  else {
                                                    pvVar4 = std::
                                                  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  ::operator[](&local_88,(long)local_a8);
                                                  iVar2 = std::__cxx11::string::compare
                                                                    ((char *)pvVar4);
                                                  if (iVar2 == 0) {
                                                    std::
                                                  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  ::operator[](&local_88,(long)(local_a8 + 1));
                                                  pcVar7 = (char *)std::__cxx11::string::c_str();
                                                  dVar10 = atof(pcVar7);
                                                  fVar9 = (float)dVar10;
                                                  if (0.0 <= fVar9) {
                                                    *(float *)(local_18 + 0xa8) = fVar9;
                                                  }
                                                  else {
                                                    StringPrintf_abi_cxx11_
                                                              ((char *)(double)fVar9,local_340,
                                                                                                                              
                                                  "Illegal -lambda_1 : \'%f\'. -lambda_1 cannot be less than zero."
                                                  );
                                                  Color::print_error(in_stack_fffffffffffffbe0);
                                                  std::__cxx11::string::~string(local_340);
                                                  local_19 = 0;
                                                  }
                                                  }
                                                  else {
                                                    pvVar4 = std::
                                                  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  ::operator[](&local_88,(long)local_a8);
                                                  iVar2 = std::__cxx11::string::compare
                                                                    ((char *)pvVar4);
                                                  if (iVar2 != 0) {
                                                    std::__cxx11::string::string(local_388);
                                                    std::
                                                  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  ::operator[](&local_88,(long)local_a8);
                                                  StrSimilar::FindSimilar
                                                            (in_stack_fffffffffffffd70,
                                                             in_stack_fffffffffffffd68,
                                                             in_stack_fffffffffffffd60,
                                                             (string *)
                                                             CONCAT44(in_stack_fffffffffffffd5c,
                                                                      in_stack_fffffffffffffd58));
                                                  std::
                                                  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  ::operator[](&local_88,(long)local_a8);
                                                  out = (string *)std::__cxx11::string::c_str();
                                                  uVar5 = std::__cxx11::string::c_str();
                                                  StringPrintf_abi_cxx11_
                                                            ((char *)local_3a8,
                                                                                                                          
                                                  "Unknow argument \'%s\'. Do you mean \'%s\' ?",out
                                                  ,uVar5);
                                                  Color::print_error(out);
                                                  std::__cxx11::string::~string(local_3a8);
                                                  local_19 = 0;
                                                  std::__cxx11::string::~string(local_388);
                                                  break;
                                                  }
                                                  std::
                                                  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  ::operator[](&local_88,(long)(local_a8 + 1));
                                                  pcVar7 = (char *)std::__cxx11::string::c_str();
                                                  dVar10 = atof(pcVar7);
                                                  local_344 = (float)dVar10;
                                                  if (0.0 <= local_344) {
                                                    *(float *)(local_18 + 0xac) = local_344;
                                                  }
                                                  else {
                                                    StringPrintf_abi_cxx11_
                                                              ((char *)(double)local_344,local_368,
                                                                                                                              
                                                  "Illegal -lambda_2 : \'%f\'. -lambda_2 cannot be less than zero."
                                                  );
                                                  Color::print_error(in_stack_fffffffffffffbe0);
                                                  std::__cxx11::string::~string(local_368);
                                                  local_19 = 0;
                                                  }
                                                  }
                                                  }
                                                  }
                                                  local_a8 = local_a8 + 2;
                                                  }
                                                  }
                                                  }
                                                }
                                              }
                                            }
                                          }
                                        }
                                      }
                                    }
                                  }
                                }
                              }
                            }
                          }
                        }
                      }
                    }
                  }
                }
              }
            }
          }
        }
      }
    }
    if ((local_19 & 1) == 0) {
      local_1 = 0;
    }
    else {
      check_conflict_train
                (in_stack_fffffffffffffdb0,
                 (HyperParam *)CONCAT44(in_stack_fffffffffffffdac,in_stack_fffffffffffffda8));
      uVar8 = std::__cxx11::string::empty();
      if (((uVar8 & 1) != 0) && ((*(byte *)(local_18 + 0x1ee) & 1) == 0)) {
        std::operator+(__lhs,(char *)in_stack_fffffffffffffc00);
        std::__cxx11::string::operator=((string *)(local_18 + 0x140),local_3d0);
        std::__cxx11::string::~string(local_3d0);
      }
      iVar2 = std::__cxx11::string::compare((char *)(local_18 + 0x48));
      if (iVar2 == 0) {
        std::__cxx11::string::operator=((string *)(local_18 + 0x48),"rmsd");
      }
      local_1 = 1;
    }
    local_3ac = 1;
    StrSimilar::~StrSimilar(&local_a2);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)CONCAT17(in_stack_fffffffffffffbf7,in_stack_fffffffffffffbf0));
  }
  else {
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::operator[]((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  *)(in_RDI + 0x18),1);
    uVar5 = std::__cxx11::string::c_str();
    StringPrintf_abi_cxx11_((char *)local_60,"Training data file: %s does not exist.",uVar5);
    Color::print_error(in_stack_fffffffffffffbe0);
    std::__cxx11::string::~string(local_60);
    local_1 = 0;
  }
  return (bool)(local_1 & 1);
}

Assistant:

bool Checker::check_train_options(HyperParam& hyper_param) {
  bool bo = true;
  /*********************************************************
   *  Check the file path of the training data             *
   *********************************************************/
  if (FileExist(args_[1].c_str())) {
    hyper_param.train_set_file = std::string(args_[1]);
  } else {
    Color::print_error(
      StringPrintf("Training data file: %s does not exist.", 
                    args_[1].c_str())
    );
    return false;
  }
  /*********************************************************
   *  Check each input argument                            *
   *********************************************************/
  StringList list(args_.begin()+2, args_.end());
  StrSimilar ss;
  for (int i = 0; i < list.size(); ) {
    if (list[i].compare("-s") == 0) {  // task type
      int value = atoi(list[i+1].c_str());
      if (value < 0 || value > 5) {
        Color::print_error(
            "-s can only be [0 - 5] : \n"
            "  for classification task: \n"
            "    0 -- linear model (GLM) \n"
            "    1 -- factorization machines (FM) \n"
            "    2 -- field-aware factorization machines (FFM) \n"
            "  for regression task: \n"
            "    3 -- linear model (GLM) \n"
            "    4 -- factorization machines (FM) \n"
            "    5 -- field-aware factorization machines (FFM)");
        bo = false;
      } else {
        switch (value) {
          case 0:
            hyper_param.loss_func = "cross-entropy";
            hyper_param.score_func = "linear";
            break;
          case 1:
            hyper_param.loss_func = "cross-entropy";
            hyper_param.score_func = "fm";
            break;
          case 2:
            hyper_param.loss_func = "cross-entropy";
            hyper_param.score_func = "ffm";
            break;
          case 3:
            hyper_param.loss_func = "squared";
            hyper_param.score_func = "linear";
            break;
          case 4:
            hyper_param.loss_func = "squared";
            hyper_param.score_func = "fm";
            break;
          case 5:
            hyper_param.loss_func = "squared";
            hyper_param.score_func = "ffm";
            break;
          default: break;
        }
      }
      i += 2;
    } else if (list[i].compare("-x") == 0) {  // metrics
      if (list[i+1].compare("acc") != 0 &&
          list[i+1].compare("prec") != 0 &&
          list[i+1].compare("recall") != 0 &&
          list[i+1].compare("f1") != 0 &&
          list[i+1].compare("auc") != 0 &&
          list[i+1].compare("mae") != 0 &&
          list[i+1].compare("mape") != 0 &&
          list[i+1].compare("rmsd") != 0 &&
          list[i+1].compare("rmse") != 0 &&
          list[i+1].compare("none") != 0) {
        Color::print_error(
          StringPrintf("Unknow metric: %s \n"
               " -x can only be: \n"
               "   acc \n"
               "   prec \n" 
               "   recall \n"
               "   f1 \n"
               "   auc\n"
               "   mae \n"
               "   mape \n"
               "   rmsd \n"
               "   rmse \n"
               "   none",
               list[i+1].c_str())
        );
        bo = false;
      } else {
        hyper_param.metric = list[i+1];
      }
      i += 2;
    } else if (list[i].compare("-p") == 0) {  // optimization method
      if (list[i+1].compare("adagrad") != 0 &&
          list[i+1].compare("ftrl") != 0 &&
          list[i+1].compare("sgd") != 0) {
        Color::print_error(
          StringPrintf("Unknow optimization method: %s \n"
               " -o can only be: adagrad and ftrl. \n",
               list[i+1].c_str())
        );
        bo = false;
      } else {
        hyper_param.opt_type = list[i+1];
      }
      i += 2;
    } else if (list[i].compare("-v") == 0) {  // validation file
      if (FileExist(list[i+1].c_str())) {
        hyper_param.validate_set_file = list[i+1];
      } else {
        Color::print_error(
          StringPrintf("Validation set file: %s dose not exists.",
                       list[i+1].c_str())
        );
        bo = false;
      }
      i += 2;
    } else if (list[i].compare("-m") == 0) {  // model file
      hyper_param.model_file = list[i+1];
      i += 2;
    } else if (list[i].compare("-t") == 0) { // txt model file
      hyper_param.txt_model_file = list[i+1];
      i += 2;
    } else if (list[i].compare("-l") == 0) {  // log file
      hyper_param.log_file = list[i+1];
      i += 2;
    } else if (list[i].compare("-k") == 0) {  // latent factor
      int value = atoi(list[i+1].c_str());
      if (value <= 0) {
        Color::print_error(
          StringPrintf("Illegal -k '%i'. -k must be geater than zero.",
               value)
        );
        bo = false;
      } else {
        hyper_param.num_K = value;
      }
      i += 2;
    } else if (list[i].compare("-r") == 0) {  // learning rate
      real_t value = atof(list[i+1].c_str());
      if (value <= 0) {
        Color::print_error(
          StringPrintf("Illegal -r : '%f'. -r must be greater than zero.",
               value)
        );
        bo = false;
      } else {
        hyper_param.learning_rate = value;
      }
      i += 2;
    } else if (list[i].compare("-b") == 0) {  // regular lambda
      real_t value = atof(list[i+1].c_str());
      if (value < 0) {
        Color::print_error(
          StringPrintf("Illegal -b : '%f' "
               "-b must be greater than or equal to zero.",
               value)
        );
        bo = false;
      } else {
        hyper_param.regu_lambda = value;
      }
      i += 2;
    } else if (list[i].compare("-u") == 0) {  // model scale
      real_t value = atof(list[i+1].c_str());
      if (value <= 0) {
        Color::print_error(
          StringPrintf("Illegal -u : '%f'. -u must be greater than zero.",
               value)
        );
        bo = false;
      } else {
        hyper_param.model_scale = value;
      }
      i += 2;
    } else if (list[i].compare("-e") == 0) {  // number of epoch
      int value = atoi(list[i+1].c_str());
      if (value < 0) {
        Color::print_error(
          StringPrintf("Illegal -e : '%i'. -e must be greater than zero.",
               value)
        );
        bo = false;
      } else {
        hyper_param.num_epoch = value;
      }
      i += 2;
    } else if (list[i].compare("-f") == 0) {  // number of folds
      int value = atoi(list[i+1].c_str());
      if (value < 0) {
        Color::print_error(
          StringPrintf("Illegal -f : '%i'. -f must be greater than zero.",
               value)
        );
        bo = false;
      } else {
        hyper_param.num_folds = value;
      }
      i += 2;
    } else if (list[i].compare("-pre") == 0) {  // pre-trained model
      hyper_param.pre_model_file = list[i+1];
      i += 2;
    } else if (list[i].compare("-nthread") == 0) {  // number of thread
      int value = atoi(list[i+1].c_str());
      if (value <= 0) {
        Color::print_error(
          StringPrintf("Illegal -nthread : '%i'. -nthread must be greater than zero.",
               value)
        );
        bo = false;
      } else {
        hyper_param.thread_number = value;
      }
      i += 2;
    } else if (list[i].compare("-block") == 0) {  // block size for on-disk training
      int value = atoi(list[i+1].c_str());
      if (value <= 0) {
        Color::print_error(
          StringPrintf("Illegal -block : '%i'. -block must be greater than zero.",
               value)
        );
        bo = false;
      } else {
        hyper_param.block_size = value;
      }
      i += 2;
    } else if (list[i].compare("-sw") == 0) {  // window size for early stopping
      int value = atoi(list[i+1].c_str());
      if (value < 1) {
        Color::print_error(
          StringPrintf("Illegal -sw : '%i'. -sw must be greater than or equal to 1.",
               value)
        );
        bo = false;
      } else {
        hyper_param.stop_window = value;
      }
      i += 2;
    } else if (list[i].compare("-seed") == 0) {  // random seed
      int value = atoi(list[i+1].c_str());
      if (value < 1) {
        Color::print_error(
          StringPrintf("Illegal -seed : '%i'. -seed must be greater than or equal to 1.",
               value)
        );
        bo = false;
      } else {
        hyper_param.seed = value;
      }
      i += 2;
    } else if (list[i].compare("--disk") == 0) {  // on-disk training
      hyper_param.on_disk = true;
      i += 1;
    } else if (list[i].compare("--cv") == 0) {  // cross-validation
      hyper_param.cross_validation = true;
      i += 1;
    } else if (list[i].compare("--dis-lock-free") == 0) {  // lock-free training
      hyper_param.lock_free = false;
      i += 1;
    } else if (list[i].compare("--dis-es") == 0) {  // disable early-stop
      hyper_param.early_stop = false;
      i += 1;
    } else if (list[i].compare("--no-norm") == 0) {  // normalization
      hyper_param.norm = false;
      i += 1;
    } else if (list[i].compare("--no-bin") == 0) {  // do not generate bin file
      hyper_param.bin_out = false;
      i += 1;
    } else if (list[i].compare("--quiet") == 0) {  // quiet
      hyper_param.quiet = true;
      i += 1;
    } else if (list[i].compare("-alpha") == 0) {  // alpha
      real_t value = atof(list[i+1].c_str());
      if (value <= 0) {
        Color::print_error(
          StringPrintf("Illegal -alpha : '%f'. "
                       "-alpha must be greater than zero.",
               value)
        );
        bo = false;
      } else {
        hyper_param.alpha = value;
      }
      i += 2;
    } else if (list[i].compare("-beta") == 0) {  // beta
      real_t value = atof(list[i+1].c_str());
      if (value < 0) {
        Color::print_error(
          StringPrintf("Illegal -beta : '%f'. "
                       "-beta cannot be less than zero.",
               value)
        );
        bo = false;
      } else {
        hyper_param.beta = value;
      }
      i += 2;
    } else if (list[i].compare("-lambda_1") == 0) {  // lambda_1
      real_t value = atof(list[i+1].c_str());
      if (value < 0) {
        Color::print_error(
          StringPrintf("Illegal -lambda_1 : '%f'. "
                       "-lambda_1 cannot be less than zero.",
               value)
        );
        bo = false;
      } else {
        hyper_param.lambda_1 = value;
      }
      i += 2;
    } else if (list[i].compare("-lambda_2") == 0) { // lambda_2
      real_t value = atof(list[i+1].c_str());
      if (value < 0) {
        Color::print_error(
          StringPrintf("Illegal -lambda_2 : '%f'. "
                       "-lambda_2 cannot be less than zero.",
               value)
        );
        bo = false;
      } else {
        hyper_param.lambda_2 = value;
      }
      i += 2;
    } else {  // no match
      std::string similar_str;
      ss.FindSimilar(list[i], menu_, similar_str);
      Color::print_error(
        StringPrintf("Unknow argument '%s'. Do you mean '%s' ?",
             list[i].c_str(),
             similar_str.c_str())
      );
      bo = false;
      break;
    }
  }
  if (!bo) { return false; }
  /*********************************************************
   *  Check warning and fix conflict                       *
   *********************************************************/
  check_conflict_train(hyper_param);
  /*********************************************************
   *  Set default value                                    *
   *********************************************************/
  if (hyper_param.model_file.empty() && !hyper_param.cross_validation) {
    hyper_param.model_file = hyper_param.train_set_file + ".model";
  }
  if (hyper_param.metric.compare("rmse") == 0) {
    hyper_param.metric = "rmsd";
  }

  return true;
}